

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_do_slider(nk_flags *state,nk_command_buffer *out,nk_rect bounds,float min,float val,
                  float max,float step,nk_style_slider *style,nk_input *in,nk_user_font *font)

{
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect bounds_02;
  int iVar1;
  float fVar2;
  float fVar3;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_ac;
  float local_a8;
  nk_rect button;
  nk_flags ws;
  nk_rect logical_cursor;
  nk_rect visual_cursor;
  float cursor_offset;
  float slider_steps;
  float slider_value;
  float slider_max;
  float slider_min;
  float slider_range;
  nk_user_font *font_local;
  nk_input *in_local;
  nk_style_slider *style_local;
  float step_local;
  float max_local;
  float val_local;
  float min_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_18;
  nk_rect bounds_local;
  
  state_local._4_4_ = bounds.x;
  fStack_18 = bounds.y;
  bounds_local.x = bounds.w;
  bounds_local.y = bounds.h;
  if (style == (nk_style_slider *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5281,
                  "float nk_do_slider(nk_flags *, struct nk_command_buffer *, struct nk_rect, float, float, float, float, const struct nk_style_slider *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out != (nk_command_buffer *)0x0) {
    if ((out == (nk_command_buffer *)0x0) || (style == (nk_style_slider *)0x0)) {
      bounds_local.w = 0.0;
    }
    else {
      state_local._4_4_ = state_local._4_4_ + (style->padding).x;
      fVar2 = fStack_18 + (style->padding).y;
      if ((style->padding).y * 2.0 <= bounds_local.y) {
        local_a8 = bounds_local.y;
      }
      else {
        local_a8 = (style->padding).y * 2.0;
      }
      fVar3 = (style->padding).x;
      if (fVar3 + fVar3 + (style->cursor_size).x <= bounds_local.x) {
        local_ac = bounds_local.x;
      }
      else {
        fVar3 = (style->padding).x;
        local_ac = fVar3 + fVar3 + (style->cursor_size).x;
      }
      fVar3 = (style->padding).x;
      bounds_local.x = local_ac - (fVar3 + fVar3);
      fVar3 = (style->padding).y;
      bounds_local.y = local_a8 - (fVar3 + fVar3);
      step_local = val;
      fStack_18 = fVar2;
      if (style->show_buttons != 0) {
        bounds_00.y = fVar2;
        bounds_00.x = state_local._4_4_;
        bounds_00.w = bounds_local.y;
        bounds_00.h = bounds_local.y;
        button.x = bounds_local.y;
        button.y = bounds_local.y;
        iVar1 = nk_do_button_symbol((nk_flags *)&button.w,out,bounds_00,style->dec_symbol,
                                    NK_BUTTON_DEFAULT,&style->dec_button,in,font);
        if (iVar1 != 0) {
          step_local = val - step;
        }
        bounds_01.y = fVar2;
        bounds_01.x = (state_local._4_4_ + bounds_local.x) - button.x;
        bounds_01.w = button.x;
        bounds_01.h = button.y;
        iVar1 = nk_do_button_symbol((nk_flags *)&button.w,out,bounds_01,style->inc_symbol,
                                    NK_BUTTON_DEFAULT,&style->inc_button,in,font);
        if (iVar1 != 0) {
          step_local = step + step_local;
        }
        state_local._4_4_ = state_local._4_4_ + button.x + (style->spacing).x;
        bounds_local.x = bounds_local.x - (button.x + button.x + (style->spacing).x * 2.0);
      }
      state_local._4_4_ = (style->cursor_size).x * 0.5 + state_local._4_4_;
      bounds_local.x = bounds_local.x - (style->cursor_size).x;
      local_b4 = max;
      if (min < max) {
        local_b4 = min;
        min = max;
      }
      local_b8 = min;
      if (step_local < min) {
        local_b8 = step_local;
      }
      if (local_b4 <= local_b8) {
        local_c0 = min;
        if (step_local < min) {
          local_c0 = step_local;
        }
        local_bc = local_c0;
      }
      else {
        local_bc = local_b4;
      }
      fVar3 = (min - local_b4) / step;
      logical_cursor.y = bounds_local.y;
      logical_cursor.x = bounds_local.x / fVar3;
      button.h = logical_cursor.x * ((local_bc - local_b4) / step) + state_local._4_4_;
      fVar2 = (style->cursor_size).x;
      logical_cursor.h = (bounds_local.y * 0.5 + fStack_18) - (style->cursor_size).y * 0.5;
      logical_cursor.w = button.h - fVar2 * 0.5;
      bounds_02.y = fStack_18;
      bounds_02.x = state_local._4_4_;
      bounds_02.w = bounds_local.x;
      bounds_02.h = bounds_local.y;
      fVar3 = nk_slider_behavior(state,(nk_rect *)&button.h,(nk_rect *)&logical_cursor.w,in,
                                 bounds_02,local_b4,min,local_bc,step,fVar3);
      logical_cursor.w = -fVar2 * 0.5 + button.h;
      if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      }
      nk_draw_slider(out,*state,style,(nk_rect *)((long)&state_local + 4),
                     (nk_rect *)&logical_cursor.w,local_b4,fVar3,min);
      bounds_local.w = fVar3;
      if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
      }
    }
    return bounds_local.w;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x5282,
                "float nk_do_slider(nk_flags *, struct nk_command_buffer *, struct nk_rect, float, float, float, float, const struct nk_style_slider *, struct nk_input *, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB float
nk_do_slider(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    float min, float val, float max, float step,
    const struct nk_style_slider *style, struct nk_input *in,
    const struct nk_user_font *font)
{
    float slider_range;
    float slider_min;
    float slider_max;
    float slider_value;
    float slider_steps;
    float cursor_offset;

    struct nk_rect visual_cursor;
    struct nk_rect logical_cursor;

    NK_ASSERT(style);
    NK_ASSERT(out);
    if (!out || !style)
        return 0;

    /* remove padding from slider bounds */
    bounds.x = bounds.x + style->padding.x;
    bounds.y = bounds.y + style->padding.y;
    bounds.h = NK_MAX(bounds.h, 2*style->padding.y);
    bounds.w = NK_MAX(bounds.w, 2*style->padding.x + style->cursor_size.x);
    bounds.w -= 2 * style->padding.x;
    bounds.h -= 2 * style->padding.y;

    /* optional buttons */
    if (style->show_buttons) {
        nk_flags ws;
        struct nk_rect button;
        button.y = bounds.y;
        button.w = bounds.h;
        button.h = bounds.h;

        /* decrement button */
        button.x = bounds.x;
        if (nk_do_button_symbol(&ws, out, button, style->dec_symbol, NK_BUTTON_DEFAULT,
            &style->dec_button, in, font))
            val -= step;

        /* increment button */
        button.x = (bounds.x + bounds.w) - button.w;
        if (nk_do_button_symbol(&ws, out, button, style->inc_symbol, NK_BUTTON_DEFAULT,
            &style->inc_button, in, font))
            val += step;

        bounds.x = bounds.x + button.w + style->spacing.x;
        bounds.w = bounds.w - (2*button.w + 2*style->spacing.x);
    }

    /* remove one cursor size to support visual cursor */
    bounds.x += style->cursor_size.x*0.5f;
    bounds.w -= style->cursor_size.x;

    /* make sure the provided values are correct */
    slider_max = NK_MAX(min, max);
    slider_min = NK_MIN(min, max);
    slider_value = NK_CLAMP(slider_min, val, slider_max);
    slider_range = slider_max - slider_min;
    slider_steps = slider_range / step;
    cursor_offset = (slider_value - slider_min) / step;

    /* calculate cursor
    Basically you have two cursors. One for visual representation and interaction
    and one for updating the actual cursor value. */
    logical_cursor.h = bounds.h;
    logical_cursor.w = bounds.w / slider_steps;
    logical_cursor.x = bounds.x + (logical_cursor.w * cursor_offset);
    logical_cursor.y = bounds.y;

    visual_cursor.h = style->cursor_size.y;
    visual_cursor.w = style->cursor_size.x;
    visual_cursor.y = (bounds.y + bounds.h*0.5f) - visual_cursor.h*0.5f;
    visual_cursor.x = logical_cursor.x - visual_cursor.w*0.5f;

    slider_value = nk_slider_behavior(state, &logical_cursor, &visual_cursor,
        in, bounds, slider_min, slider_max, slider_value, step, slider_steps);
    visual_cursor.x = logical_cursor.x - visual_cursor.w*0.5f;

    /* draw slider */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_slider(out, *state, style, &bounds, &visual_cursor, slider_min, slider_value, slider_max);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return slider_value;
}